

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::IfcSpatialStructureElement
          (IfcSpatialStructureElement *this)

{
  IfcSpatialStructureElement *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x158,"IfcSpatialStructureElement");
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__00f29680);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement,_2UL> *)
             &(this->super_IfcProduct).field_0x100,&PTR_construction_vtable_24__00f29730);
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0xf295a0;
  *(undefined8 *)&this->field_0x158 = 0xf29668;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0xf295c8;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf295f0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0xf29618;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0xf29640;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcProduct).field_0x110);
  std::__cxx11::string::string((string *)&this->CompositionType);
  return;
}

Assistant:

IfcSpatialStructureElement() : Object("IfcSpatialStructureElement") {}